

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-perm.c
# Opt level: O0

int borg_perma_aux_smite_evil(void)

{
  _Bool _Var1;
  int iVar2;
  int local_1c;
  int local_10;
  int cost;
  int fail_allowed;
  
  local_10 = 5;
  if (unique_on_level != 0) {
    local_10 = 10;
  }
  if (borg_fighting_unique != L'\0') {
    local_10 = 0xf;
  }
  if ((borg.temp.smite_evil) || (borg.trait[0xc2] != 0)) {
    cost = 0;
  }
  else if ((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) {
    _Var1 = borg_spell_okay_fail(SMITE_EVIL,local_10);
    if (_Var1) {
      iVar2 = borg_get_spell_power(SMITE_EVIL);
      if (unique_on_level == 0) {
        local_1c = borg.trait[0x1e] / 10;
      }
      else {
        local_1c = borg.trait[0x1e] / 7;
      }
      if (iVar2 < local_1c) {
        if ((borg_simulate & 1U) == 0) {
          _Var1 = borg_spell(SMITE_EVIL);
          if (_Var1) {
            borg.no_rest_prep = 21000;
            cost = 3;
          }
          else {
            cost = 0;
          }
        }
        else {
          cost = 3;
        }
      }
      else {
        cost = 0;
      }
    }
    else {
      cost = 0;
    }
  }
  else {
    cost = 0;
  }
  return cost;
}

Assistant:

static int borg_perma_aux_smite_evil(void)
{
    int fail_allowed = 5, cost;

    /* increase the threshold */
    if (unique_on_level)
        fail_allowed = 10;
    if (borg_fighting_unique)
        fail_allowed = 15;

    /* already smiting */
    if (borg.temp.smite_evil || borg.trait[BI_WS_EVIL])
        return 0;

    /* Cant when Blind */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED])
        return 0;

    if (!borg_spell_okay_fail(SMITE_EVIL, fail_allowed))
        return 0;

    /* Obtain the cost of the spell */
    cost = borg_get_spell_power(SMITE_EVIL);

    /* If its cheap, go ahead */
    if (cost >= ((unique_on_level) ? borg.trait[BI_CURSP] / 7
                                   : borg.trait[BI_CURSP] / 10))
        return 0;

    /* Simulation */
    /* smite evil is a low priority */
    if (borg_simulate)
        return 3;

    /* do it! */
    if (borg_spell(SMITE_EVIL)) {
        /* No resting to recoup mana */
        borg.no_rest_prep = 21000;
        return 3;
    }

    return 0;
}